

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ge.cpp
# Opt level: O3

void ge_double_scalarmult_vartime(ge_p2 *r,uchar *a,ge_p3 *A,uchar *b)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  ge_p3 u;
  ge_p1p1 t;
  char bslide [256];
  char aslide [256];
  ge_cached Ai [8];
  ge_p3 A2;
  ge_p3 gStack_918;
  ge_p1p1 local_878;
  char local_7d8 [255];
  byte abStack_6d9 [257];
  ge_cached local_5d8 [4];
  ge_cached local_358;
  ge_cached local_2b8;
  ge_cached local_218;
  ge_cached local_178;
  ge_p3 local_d0;
  
  slide((char *)(abStack_6d9 + 1),a);
  slide(local_7d8,b);
  ge_p3_to_cached(local_5d8,A);
  ge_p3_to_p2((ge_p2 *)&gStack_918,A);
  ge_p2_dbl(&local_878,(ge_p2 *)&gStack_918);
  ge_p1p1_to_p3(&local_d0,&local_878);
  ge_add(&local_878,&local_d0,local_5d8);
  ge_p1p1_to_p3(&gStack_918,&local_878);
  ge_p3_to_cached(local_5d8 + 1,&gStack_918);
  ge_add(&local_878,&local_d0,local_5d8 + 1);
  ge_p1p1_to_p3(&gStack_918,&local_878);
  ge_p3_to_cached(local_5d8 + 2,&gStack_918);
  ge_add(&local_878,&local_d0,local_5d8 + 2);
  ge_p1p1_to_p3(&gStack_918,&local_878);
  ge_p3_to_cached(local_5d8 + 3,&gStack_918);
  ge_add(&local_878,&local_d0,local_5d8 + 3);
  ge_p1p1_to_p3(&gStack_918,&local_878);
  ge_p3_to_cached(&local_358,&gStack_918);
  ge_add(&local_878,&local_d0,&local_358);
  ge_p1p1_to_p3(&gStack_918,&local_878);
  ge_p3_to_cached(&local_2b8,&gStack_918);
  ge_add(&local_878,&local_d0,&local_2b8);
  ge_p1p1_to_p3(&gStack_918,&local_878);
  ge_p3_to_cached(&local_218,&gStack_918);
  ge_add(&local_878,&local_d0,&local_218);
  ge_p1p1_to_p3(&gStack_918,&local_878);
  ge_p3_to_cached(&local_178,&gStack_918);
  fe_0(r->X);
  fe_1(r->Y);
  fe_1(r->Z);
  uVar2 = 0xff;
  while ((uVar3 = (ulong)uVar2, abStack_6d9[uVar3 + 1] == 0 && (local_7d8[uVar3] == '\0'))) {
    bVar6 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar6) {
      return;
    }
  }
  if ((int)uVar2 < 0) {
    return;
  }
  lVar4 = uVar3 + 1;
  do {
    ge_p2_dbl(&local_878,r);
    bVar1 = abStack_6d9[lVar4];
    if ((char)bVar1 < '\x01') {
      if ((char)bVar1 < '\0') {
        ge_p1p1_to_p3(&gStack_918,&local_878);
        ge_sub(&local_878,&gStack_918,
               (ge_cached *)((long)local_5d8[0].YplusX + (ulong)((uint)((byte)-bVar1 >> 1) * 0xa0)))
        ;
      }
    }
    else {
      ge_p1p1_to_p3(&gStack_918,&local_878);
      ge_add(&local_878,&gStack_918,
             (ge_cached *)((long)local_5d8[0].YplusX + (ulong)((uint)(bVar1 >> 1) * 0xa0)));
    }
    bVar1 = *(byte *)((long)local_878.T + lVar4 + 0x27);
    if ((char)bVar1 < '\x01') {
      if ((char)bVar1 < '\0') {
        ge_p1p1_to_p3(&gStack_918,&local_878);
        ge_msub(&local_878,&gStack_918,Bi + ((byte)-bVar1 >> 1));
      }
    }
    else {
      ge_p1p1_to_p3(&gStack_918,&local_878);
      ge_madd(&local_878,&gStack_918,Bi + (bVar1 >> 1));
    }
    ge_p1p1_to_p2(r,&local_878);
    lVar5 = lVar4 + -1;
    bVar6 = 0 < lVar4;
    lVar4 = lVar5;
  } while (lVar5 != 0 && bVar6);
  return;
}

Assistant:

void ge_double_scalarmult_vartime(ge_p2 *r, const unsigned char *a, const ge_p3 *A, const unsigned char *b) {
    signed char aslide[256];
    signed char bslide[256];
    ge_cached Ai[8]; /* A,3A,5A,7A,9A,11A,13A,15A */
    ge_p1p1 t;
    ge_p3 u;
    ge_p3 A2;
    int i;
    slide(aslide, a);
    slide(bslide, b);
    ge_p3_to_cached(&Ai[0], A);
    ge_p3_dbl(&t, A);
    ge_p1p1_to_p3(&A2, &t);
    ge_add(&t, &A2, &Ai[0]);
    ge_p1p1_to_p3(&u, &t);
    ge_p3_to_cached(&Ai[1], &u);
    ge_add(&t, &A2, &Ai[1]);
    ge_p1p1_to_p3(&u, &t);
    ge_p3_to_cached(&Ai[2], &u);
    ge_add(&t, &A2, &Ai[2]);
    ge_p1p1_to_p3(&u, &t);
    ge_p3_to_cached(&Ai[3], &u);
    ge_add(&t, &A2, &Ai[3]);
    ge_p1p1_to_p3(&u, &t);
    ge_p3_to_cached(&Ai[4], &u);
    ge_add(&t, &A2, &Ai[4]);
    ge_p1p1_to_p3(&u, &t);
    ge_p3_to_cached(&Ai[5], &u);
    ge_add(&t, &A2, &Ai[5]);
    ge_p1p1_to_p3(&u, &t);
    ge_p3_to_cached(&Ai[6], &u);
    ge_add(&t, &A2, &Ai[6]);
    ge_p1p1_to_p3(&u, &t);
    ge_p3_to_cached(&Ai[7], &u);
    ge_p2_0(r);

    for (i = 255; i >= 0; --i) {
        if (aslide[i] || bslide[i]) {
            break;
        }
    }

    for (; i >= 0; --i) {
        ge_p2_dbl(&t, r);

        if (aslide[i] > 0) {
            ge_p1p1_to_p3(&u, &t);
            ge_add(&t, &u, &Ai[aslide[i] / 2]);
        } else if (aslide[i] < 0) {
            ge_p1p1_to_p3(&u, &t);
            ge_sub(&t, &u, &Ai[(-aslide[i]) / 2]);
        }

        if (bslide[i] > 0) {
            ge_p1p1_to_p3(&u, &t);
            ge_madd(&t, &u, &Bi[bslide[i] / 2]);
        } else if (bslide[i] < 0) {
            ge_p1p1_to_p3(&u, &t);
            ge_msub(&t, &u, &Bi[(-bslide[i]) / 2]);
        }

        ge_p1p1_to_p2(r, &t);
    }
}